

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

Vec3 rr::advblend::setLum(Vec3 *cbase,Vec3 *clum)

{
  Vector<float,_3> *res_6;
  int i_1;
  int i;
  float *in_RDI;
  long lVar1;
  uint uVar2;
  float res_1;
  float fVar3;
  float res;
  float fVar4;
  Vec3 VVar5;
  Vec3 VVar6;
  Vec3 color;
  Vector<float,_3> res_5;
  Vector<float,_3> res_3;
  Vector<float,_3> res_4;
  
  color.m_data[0] = 0.3;
  color.m_data[1] = 0.59;
  color.m_data[2] = 0.11;
  fVar4 = 0.0;
  lVar1 = 0;
  do {
    fVar4 = fVar4 + cbase->m_data[lVar1] * color.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  color.m_data[0] = 0.3;
  color.m_data[1] = 0.59;
  color.m_data[2] = 0.11;
  VVar5.m_data._0_8_ = 0;
  lVar1 = 0;
  do {
    fVar3 = (float)VVar5.m_data._0_8_ + clum->m_data[lVar1] * color.m_data[lVar1];
    VVar5.m_data._0_8_ = CONCAT44(0.0,fVar3);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    res_5.m_data[lVar1] = fVar3 - fVar4;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  color.m_data[2] = 0.0;
  color.m_data[0] = 0.0;
  color.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    color.m_data[lVar1] = cbase->m_data[lVar1] + res_5.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  fVar4 = (float)(~-(uint)(color.m_data[0] <= color.m_data[1]) & (uint)color.m_data[1] |
                 -(uint)(color.m_data[0] <= color.m_data[1]) & (uint)color.m_data[0]);
  uVar2 = -(uint)(fVar4 <= color.m_data[2]);
  fVar4 = (float)(~uVar2 & (uint)color.m_data[2] | uVar2 & (uint)fVar4);
  if (0.0 <= fVar4) {
    fVar4 = (float)(~-(uint)(color.m_data[1] <= color.m_data[0]) & (uint)color.m_data[1] |
                   (uint)color.m_data[0] & -(uint)(color.m_data[1] <= color.m_data[0]));
    uVar2 = -(uint)(color.m_data[2] <= fVar4);
    VVar6.m_data[2] = (float)(~uVar2 & (uint)color.m_data[2] | uVar2 & (uint)fVar4);
    if (VVar6.m_data[2] <= 1.0) {
      in_RDI[2] = color.m_data[2];
      *(undefined8 *)in_RDI = color.m_data._0_8_;
      VVar6.m_data[0] = fVar3;
      VVar6.m_data[1] = 0.0;
      return (Vec3)VVar6.m_data;
    }
    res_3.m_data[2] = 0.0;
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    lVar1 = 0;
    do {
      res_3.m_data[lVar1] = color.m_data[lVar1] - fVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    res_4.m_data[2] = 0.0;
    res_4.m_data[0] = 0.0;
    res_4.m_data[1] = 0.0;
    lVar1 = 0;
    do {
      res_4.m_data[lVar1] = res_3.m_data[lVar1] * (1.0 - fVar3);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    res_5.m_data[2] = 0.0;
    res_5.m_data[0] = 0.0;
    res_5.m_data[1] = 0.0;
    lVar1 = 0;
    do {
      res_5.m_data[lVar1] =
           res_4.m_data[lVar1] /
           (float)(~-(uint)(fVar3 != VVar6.m_data[2]) & 0x3f800000 |
                  (uint)(VVar6.m_data[2] - fVar3) & -(uint)(fVar3 != VVar6.m_data[2]));
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    in_RDI[2] = 0.0;
    in_RDI[0] = 0.0;
    in_RDI[1] = 0.0;
    lVar1 = 0;
    do {
      fVar4 = res_5.m_data[lVar1] + fVar3;
      in_RDI[lVar1] = fVar4;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  else {
    res_3.m_data[2] = 0.0;
    res_3.m_data[0] = 0.0;
    res_3.m_data[1] = 0.0;
    lVar1 = 0;
    do {
      res_3.m_data[lVar1] = color.m_data[lVar1] - fVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    res_4.m_data[2] = 0.0;
    res_4.m_data[0] = 0.0;
    res_4.m_data[1] = 0.0;
    lVar1 = 0;
    do {
      res_4.m_data[lVar1] = res_3.m_data[lVar1] * fVar3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    res_5.m_data[2] = 0.0;
    res_5.m_data[0] = 0.0;
    res_5.m_data[1] = 0.0;
    lVar1 = 0;
    do {
      res_5.m_data[lVar1] =
           res_4.m_data[lVar1] /
           (float)(~-(uint)(fVar4 != fVar3) & 0x3f800000 |
                  (uint)(fVar3 - fVar4) & -(uint)(fVar4 != fVar3));
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
    in_RDI[2] = 0.0;
    in_RDI[0] = 0.0;
    in_RDI[1] = 0.0;
    lVar1 = 0;
    do {
      fVar4 = res_5.m_data[lVar1] + fVar3;
      in_RDI[lVar1] = fVar4;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 3);
  }
  VVar5.m_data[2] = fVar4;
  return (Vec3)VVar5.m_data;
}

Assistant:

Vec3 setLum (const Vec3& cbase, const Vec3& clum)
{
	const float		lbase	= luminosity(cbase);
	const float		llum	= luminosity(clum);
	const float		ldiff	= llum - lbase;
	const Vec3		color	= cbase + Vec3(ldiff);
	const float		minC	= minComp(color);
	const float		maxC	= maxComp(color);

	if (minC < 0.0f)
		return llum + ((color-llum)*llum / (llum != minC ? (llum-minC) : 1.0f));
	else if (maxC > 1.0f)
		return llum + ((color-llum)*(1.0f-llum) / (llum != maxC ? (maxC-llum) : 1.0f));
	else
		return color;
}